

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Function * __thiscall soul::PoolAllocator::allocate<soul::heart::Function>(PoolAllocator *this)

{
  SourceCodeText *pSVar1;
  UTF8Reader *this_00;
  _lambda_void___1_ local_21;
  Function *local_20;
  Function *newObject;
  PoolItem *newItem;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)this;
  newObject = (Function *)allocateSpaceForObject(this,0xe0);
  this_00 = &(newObject->super_Object).location.location;
  memset(this_00,0,0xe0);
  heart::Function::Function((Function *)this_00);
  local_20 = (Function *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate()::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_21);
  (newObject->super_Object).location.sourceCode.object = pSVar1;
  return local_20;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }